

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-simple.c
# Opt level: O0

void host_ui_event(HostUI *ui,SDL_Event *event)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_48;
  f32 new_top;
  f32 new_left;
  f32 new_h;
  f32 new_w;
  f32 want_aspect;
  f32 aspect;
  f32 h;
  f32 w;
  int ih;
  int iw;
  SDL_Event *event_local;
  HostUI *ui_local;
  
  if ((event->type == 0x200) &&
     (((event->display).event == '\x01' || ((event->display).event == '\x05')))) {
    _ih = event;
    event_local = (SDL_Event *)ui;
    SDL_GL_GetDrawableSize(ui->window,&w,&h);
    fVar1 = (float)(int)w;
    fVar2 = (float)(int)h;
    fVar3 = (float)(event_local->motion).xrel / (float)(event_local->motion).yrel;
    if (fVar3 <= fVar1 / fVar2) {
      fVar3 = fVar2 * fVar3;
      local_48 = fVar2;
    }
    else {
      local_48 = fVar1 / fVar3;
      fVar3 = fVar1;
    }
    glViewport((int)((fVar1 - fVar3) * 0.5),(int)((fVar2 - local_48) * 0.5),(int)fVar3,(int)local_48
              );
  }
  return;
}

Assistant:

void host_ui_event(struct HostUI* ui, union SDL_Event* event) {
  if (event->type == SDL_WINDOWEVENT &&
      (event->window.event == SDL_WINDOWEVENT_SHOWN ||
       event->window.event == SDL_WINDOWEVENT_RESIZED)) {
    int iw, ih;
    SDL_GL_GetDrawableSize(ui->window, &iw, &ih);
    f32 w = iw, h = ih;
    f32 aspect = w / h;
    f32 want_aspect = (f32)ui->width / ui->height;
    f32 new_w = aspect < want_aspect ? w : h * want_aspect;
    f32 new_h = aspect < want_aspect ? w / want_aspect : h;
    f32 new_left = (w - new_w) * 0.5f;
    f32 new_top = (h - new_h) * 0.5f;
    glViewport(new_left, new_top, new_w, new_h);
  }
}